

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

int __thiscall
TPZBlockDiagonal<std::complex<float>_>::Substitution
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  long lVar1;
  int64_t iVar2;
  int64_t iVar3;
  long *plVar4;
  int *piVar5;
  complex<float> *pcVar6;
  TPZBaseMatrix *in_RSI;
  long in_RDI;
  complex<float> *ptr;
  TPZFMatrix<std::complex<float>_> BTemp;
  int64_t nc;
  int64_t c;
  int64_t eq;
  int64_t bsize;
  int64_t pos;
  int64_t nb;
  int64_t b;
  int64_t in_stack_ffffffffffffff10;
  int64_t in_stack_ffffffffffffff18;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff20;
  int64_t in_stack_ffffffffffffff60;
  complex<float> *in_stack_ffffffffffffff68;
  int64_t in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffff78;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff80;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff90;
  int64_t in_stack_ffffffffffffff98;
  complex<float> *in_stack_ffffffffffffffa0;
  long local_40;
  int64_t local_18;
  
  if (*(char *)(in_RDI + 0x18) != '\x01') {
    TPZMatrix<std::complex<float>_>::Error((char *)this,(char *)B);
  }
  iVar2 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x60));
  iVar3 = TPZBaseMatrix::Cols(in_RSI);
  for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
    for (local_18 = 0; local_18 < iVar2; local_18 = local_18 + 1) {
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_18);
      lVar1 = *plVar4;
      piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_18);
      if (*piVar5 != 0) {
        TPZFMatrix<std::complex<float>_>::operator()
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        TPZFMatrix<std::complex<float>_>::TPZFMatrix
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        pcVar6 = TPZVec<std::complex<float>_>::begin
                           ((TPZVec<std::complex<float>_> *)(in_RDI + 0x20));
        in_stack_ffffffffffffff20 = (TPZFMatrix<std::complex<float>_> *)(pcVar6 + lVar1);
        TPZFMatrix<std::complex<float>_>::Substitution
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x11f48b6)
        ;
      }
    }
  }
  return 1;
}

Assistant:

int
TPZBlockDiagonal<TVar>::Substitution( TPZFMatrix<TVar> *B) const
{
	if(this->fDecomposed != ELU) {
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZBlockDiagonal::Decompose_LU is decomposed with other scheme");
	}
	
	int64_t b,nb,pos,bsize,eq=0;
	nb = fBlockSize.NElements();
	int64_t c, nc = B->Cols();
	for(c=0; c<nc; c++) {
		eq = 0;
		for(b=0;b<nb; b++) {
			pos = fBlockPos[b];
			bsize = fBlockSize[b];
			if(!bsize) continue;
			TPZFMatrix<TVar> BTemp(bsize,1,&(B->operator()(eq,c)),bsize);
			TVar *ptr = fStorage.begin()+pos;
			TPZFMatrix<TVar>::Substitution(ptr,bsize,&BTemp);
			eq+= bsize;
		}
	}
	return 1;
}